

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O1

Result wabt::ValidateModule(Module *module,Errors *errors,ValidateOptions *options)

{
  Result RVar1;
  Validator validator;
  Validator local_2c0;
  
  local_2c0.super_Delegate._vptr_Delegate = (_func_int **)&PTR__Validator_0022b050;
  local_2c0.options_ = options;
  local_2c0.errors_ = errors;
  SharedValidator::SharedValidator(&local_2c0.validator_,errors,options);
  local_2c0.result_.enum_ = Ok;
  local_2c0.current_module_ = module;
  RVar1 = anon_unknown_4::Validator::CheckModule(&local_2c0);
  local_2c0.super_Delegate._vptr_Delegate = (_func_int **)&PTR__Validator_0022b050;
  SharedValidator::~SharedValidator(&local_2c0.validator_);
  return (Result)RVar1.enum_;
}

Assistant:

Result ValidateModule(const Module* module,
                      Errors* errors,
                      const ValidateOptions& options) {
  Validator validator(errors, module, options);

  return validator.CheckModule();
}